

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O1

void opus_ifft_c(kiss_fft_state *st,kiss_fft_cpx *fin,kiss_fft_cpx *fout)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = st->nfft;
  if (0 < (int)uVar2) {
    lVar3 = 0;
    do {
      fout[st->bitrev[lVar3]] = fin[lVar3];
      lVar3 = lVar3 + 1;
      uVar2 = st->nfft;
    } while (lVar3 < (int)uVar2);
  }
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      fout[uVar4].i = -fout[uVar4].i;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  opus_fft_impl(st,fout);
  iVar1 = st->nfft;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      fout[lVar3].i = -fout[lVar3].i;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  return;
}

Assistant:

void opus_ifft_c(const kiss_fft_state *st, const kiss_fft_cpx *fin, kiss_fft_cpx *fout) {
    int i;
    celt_assert2 (fin != fout, "In-place FFT not supported");
    /* Bit-reverse the input */
    for (i = 0; i < st->nfft; i++)
        fout[st->bitrev[i]] = fin[i];
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
    opus_fft_impl(st, fout);
    for (i = 0; i < st->nfft; i++)
        fout[i].i = -fout[i].i;
}